

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

int __thiscall QCompletionModel::completionCount(QCompletionModel *this)

{
  QCompletionEngine *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  pQVar1 = (this->engine).d;
  if ((pQVar1->curMatch).indices.v == true) {
    iVar3 = (int)(pQVar1->curMatch).indices.vector.d.size;
  }
  else {
    iVar3 = ((pQVar1->curMatch).indices.t - (pQVar1->curMatch).indices.f) + 1;
  }
  if ((pQVar1->historyMatch).indices.v == true) {
    iVar4 = (int)(pQVar1->historyMatch).indices.vector.d.size;
  }
  else {
    iVar4 = ((pQVar1->historyMatch).indices.t - (pQVar1->historyMatch).indices.f) + 1;
  }
  iVar2 = 0;
  if (iVar4 + iVar3 != 0) {
    (*pQVar1->_vptr_QCompletionEngine[2])(pQVar1,0x7fffffff);
    pQVar1 = (this->engine).d;
    if ((pQVar1->curMatch).indices.v == true) {
      iVar3 = (int)(pQVar1->curMatch).indices.vector.d.size;
    }
    else {
      iVar3 = ((pQVar1->curMatch).indices.t - (pQVar1->curMatch).indices.f) + 1;
    }
    if ((pQVar1->historyMatch).indices.v == true) {
      iVar2 = (int)(pQVar1->historyMatch).indices.vector.d.size;
    }
    else {
      iVar2 = ((pQVar1->historyMatch).indices.t - (pQVar1->historyMatch).indices.f) + 1;
    }
    iVar2 = iVar2 + iVar3;
  }
  return iVar2;
}

Assistant:

int QCompletionModel::completionCount() const
{
    if (!engine->matchCount())
        return 0;

    engine->filterOnDemand(INT_MAX);
    return engine->matchCount();
}